

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfo *
embree::sse2::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,mvector<SubGridBuildData> *sgrids,
          BuildProgressMonitor *progressMonitor)

{
  Geometry *pGVar1;
  Ref<embree::Geometry> *pRVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  task *ptVar7;
  runtime_error *prVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  ulong uVar10;
  size_t *psVar11;
  long lVar12;
  size_t *psVar13;
  size_t sVar14;
  _func_int **pp_Var15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  size_t sVar30;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_2dd9;
  _func_int **local_2dd8;
  long **local_2dd0;
  task_traits local_2dc8;
  undefined4 local_2dbc;
  mvector<PrimRef> *local_2db8;
  Scene **local_2db0;
  size_t local_2da8;
  mvector<PrimRef> **local_2da0;
  Scene **local_2d98;
  Scene *local_2d90;
  GTypeMask local_2d88;
  undefined1 local_2d80;
  mvector<PrimRef> *local_2d78;
  mvector<SubGridBuildData> *local_2d70;
  undefined8 local_2d68;
  undefined8 uStack_2d60;
  undefined8 local_2d58;
  undefined8 uStack_2d50;
  undefined8 local_2d48;
  undefined8 uStack_2d40;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  size_t local_2d28;
  size_t sStack_2d20;
  long *local_2d18;
  _func_int ***local_2d10;
  undefined8 *local_2d08;
  Scene ***local_2d00;
  undefined1 *local_2cf8;
  mvector<PrimRef> ***local_2cf0;
  undefined8 local_2ce8;
  undefined4 local_2ce0;
  wait_context local_2cd8;
  task_group_context local_2cc8;
  long local_2c48 [64];
  ulong local_2a48 [64];
  _func_int **local_2848;
  ulong local_2840;
  size_t local_13f8 [633];
  
  local_2848 = (_func_int **)0x0;
  uVar21 = 0;
  local_2db8 = prims;
  local_2da8 = numPrimRefs;
  local_2d90 = scene;
  local_2d88 = types;
  local_2d80 = mblur;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar30 = (scene->geometries).size_active;
  if (sVar30 != 0) {
    uVar21 = 0;
    sVar14 = 0;
    do {
      pGVar1 = (scene->geometries).items[sVar14].ptr;
      if ((((pGVar1 == (Geometry *)0x0) || (((uint)pGVar1->field_8 >> 0x15 & 1) == 0)) ||
          ((1 << (SUB41(pGVar1->field_8,0) & 0x1f) & types) == ~MTY_ALL)) ||
         ((pGVar1->numTimeSteps == 1) == mblur)) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)pGVar1->numPrimitives;
      }
      uVar21 = uVar21 + uVar9;
      sVar14 = sVar14 + 1;
    } while (sVar30 != sVar14);
  }
  local_2dbc = (undefined4)CONCAT71(in_register_00000009,mblur);
  local_2840 = uVar21;
  iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar9 = uVar21 + 0x3ff >> 10;
  if ((ulong)(long)iVar5 < uVar9) {
    uVar9 = (long)iVar5;
  }
  uVar18 = 0x40;
  if (uVar9 < 0x40) {
    uVar18 = uVar9;
  }
  pp_Var20 = (_func_int **)(uVar18 + (uVar18 == 0));
  local_2c48[0] = 0;
  local_2a48[0] = 0;
  local_2848 = pp_Var20;
  if (1 < uVar9) {
    uVar18 = 0;
    uVar9 = uVar21 / (ulong)pp_Var20;
    pRVar2 = (scene->geometries).items;
    pp_Var15 = (_func_int **)0x1;
    lVar16 = 0;
    do {
      pGVar1 = pRVar2[lVar16].ptr;
      if (((pGVar1 == (Geometry *)0x0) || (((uint)pGVar1->field_8 >> 0x15 & 1) == 0)) ||
         (((1 << (SUB41(pGVar1->field_8,0) & 0x1f) & types) == ~MTY_ALL ||
          (((pGVar1->numTimeSteps == 1) == (bool)(char)local_2dbc ||
           (uVar17 = (ulong)pGVar1->numPrimitives, uVar17 == 0)))))) {
        uVar17 = 0;
        lVar12 = 0;
      }
      else {
        uVar10 = ((long)pp_Var15 + 1) * uVar21;
        lVar12 = 0;
        uVar19 = 0;
        do {
          uVar6 = uVar9;
          uVar9 = uVar6;
          if ((uVar18 + uVar17 + lVar12 < uVar6) || (pp_Var20 <= pp_Var15)) break;
          local_2c48[(long)pp_Var15] = lVar16;
          uVar19 = uVar19 + (uVar6 - uVar18);
          local_2a48[(long)pp_Var15] = uVar19;
          pp_Var15 = (_func_int **)((long)pp_Var15 + 1);
          uVar9 = uVar10 / (ulong)local_2848;
          lVar12 = -uVar19;
          uVar10 = uVar10 + uVar21;
          uVar18 = uVar6;
          pp_Var20 = local_2848;
        } while (uVar19 < uVar17);
      }
      uVar18 = uVar17 + uVar18 + lVar12;
      lVar16 = lVar16 + 1;
    } while (pp_Var15 < pp_Var20);
  }
  local_2d68 = 0x7f8000007f800000;
  uStack_2d60 = 0x7f8000007f800000;
  local_2d58 = 0xff800000ff800000;
  uStack_2d50 = 0xff800000ff800000;
  local_2d48 = 0x7f8000007f800000;
  uStack_2d40 = 0x7f8000007f800000;
  local_2d38 = 0xff800000ff800000;
  uStack_2d30 = 0xff800000ff800000;
  local_2d28 = 0;
  sStack_2d20 = 0;
  local_2d78 = local_2db8;
  local_2d70 = sgrids;
  local_2db0 = &local_2d90;
  local_2d00 = &local_2db0;
  local_2cf0 = &local_2da0;
  local_2d10 = &local_2dd8;
  local_2d18 = local_2c48;
  local_2cf8 = &local_2dd9;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2dd8 = pp_Var20;
  local_2da0 = &local_2d78;
  local_2d98 = local_2db0;
  local_2d08 = &local_2d68;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2dc8.m_version_and_traits = 0;
  local_2dd0 = &local_2d18;
  ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2dc8,0xc0);
  ptVar7->m_reserved[3] = 0;
  ptVar7->m_reserved[4] = 0;
  ptVar7->m_reserved[1] = 0;
  ptVar7->m_reserved[2] = 0;
  (ptVar7->super_task_traits).m_version_and_traits = 0;
  ptVar7->m_reserved[0] = 0;
  ptVar7->m_reserved[5] = 0;
  ptVar7->_vptr_task = (_func_int **)&PTR__task_02189fa8;
  ptVar7[1]._vptr_task = pp_Var20;
  ptVar7[1].super_task_traits.m_version_and_traits = 0;
  ptVar7[1].m_reserved[0] = 1;
  ptVar7[1].m_reserved[1] = (uint64_t)&local_2dd0;
  ptVar7[1].m_reserved[2] = 0;
  ptVar7[1].m_reserved[3] = 1;
  iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  *(undefined4 *)&ptVar7[2]._vptr_task = 0;
  *(undefined1 *)((long)&ptVar7[2]._vptr_task + 4) = 5;
  ptVar7[1].m_reserved[5] = (long)iVar5 * 2 & 0x7ffffffffffffffe;
  ptVar7[2].super_task_traits.m_version_and_traits = local_2dc8.m_version_and_traits;
  local_2ce8 = 0;
  local_2ce0 = 1;
  local_2cd8.m_version_and_traits = 1;
  local_2cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  ptVar7[1].m_reserved[4] = (uint64_t)&local_2ce8;
  tbb::detail::r1::execute_and_wait(ptVar7,&local_2cc8,&local_2cd8,&local_2cc8);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar4 != '\0') {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"task cancelled");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  aVar22._8_8_ = uStack_2d60;
  aVar22._0_8_ = local_2d68;
  aVar24._8_8_ = uStack_2d50;
  aVar24._0_8_ = local_2d58;
  aVar26._8_8_ = uStack_2d40;
  aVar26._0_8_ = local_2d48;
  aVar28._8_8_ = uStack_2d30;
  aVar28._0_8_ = local_2d38;
  __return_storage_ptr__->begin = local_2d28;
  __return_storage_ptr__->end = sStack_2d20;
  if (local_2dd8 == (_func_int **)0x0) {
    sVar30 = __return_storage_ptr__->begin;
    sVar14 = __return_storage_ptr__->end;
  }
  else {
    psVar11 = &__return_storage_ptr__->begin;
    sVar30 = *psVar11;
    sVar14 = __return_storage_ptr__->end;
    psVar13 = local_13f8;
    pp_Var20 = local_2dd8;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar13 + -8) = aVar22;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar13 + -6) = aVar24;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar13 + -4) = aVar26;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar13 + -2) = aVar28;
      sVar3 = __return_storage_ptr__->end;
      *psVar13 = *psVar11;
      psVar13[1] = sVar3;
      aVar22.m128 = (__m128)minps(aVar22.m128,*(undefined1 (*) [16])(psVar13 + -0x288));
      aVar24.m128 = (__m128)maxps(aVar24.m128,*(undefined1 (*) [16])(psVar13 + -0x286));
      aVar26.m128 = (__m128)minps(aVar26.m128,*(undefined1 (*) [16])(psVar13 + -0x284));
      aVar28.m128 = (__m128)maxps(aVar28.m128,*(undefined1 (*) [16])(psVar13 + -0x282));
      sVar30 = sVar30 + psVar13[-0x280];
      sVar14 = sVar14 + psVar13[-0x27f];
      *psVar11 = sVar30;
      __return_storage_ptr__->end = sVar14;
      psVar13 = psVar13 + 10;
      pp_Var20 = (_func_int **)((long)pp_Var20 + -1);
    } while (pp_Var20 != (_func_int **)0x0);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar26;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar28;
  if (sVar14 - sVar30 != local_2da8) {
    (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
    pp_Var20 = local_2848;
    local_2d68 = 0x7f8000007f800000;
    uStack_2d60 = 0x7f8000007f800000;
    local_2d58 = 0xff800000ff800000;
    uStack_2d50 = 0xff800000ff800000;
    local_2d48 = 0x7f8000007f800000;
    uStack_2d40 = 0x7f8000007f800000;
    local_2d38 = 0xff800000ff800000;
    uStack_2d30 = 0xff800000ff800000;
    local_2d28 = 0;
    sStack_2d20 = 0;
    local_2d78 = local_2db8;
    local_2d70 = sgrids;
    local_2db0 = &local_2d90;
    local_2dd8 = local_2848;
    local_2d18 = local_2c48;
    local_2d10 = &local_2dd8;
    local_2d00 = &local_2db0;
    local_2cf8 = &local_2dd9;
    local_2cf0 = &local_2da0;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2da0 = &local_2d78;
    local_2d98 = local_2db0;
    local_2d08 = &local_2d68;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2dd0 = &local_2d18;
    if (pp_Var20 != (_func_int **)0x0) {
      local_2dc8.m_version_and_traits = 0;
      ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2dc8,0xc0);
      ptVar7->m_reserved[3] = 0;
      ptVar7->m_reserved[4] = 0;
      ptVar7->m_reserved[1] = 0;
      ptVar7->m_reserved[2] = 0;
      (ptVar7->super_task_traits).m_version_and_traits = 0;
      ptVar7->m_reserved[0] = 0;
      ptVar7->m_reserved[5] = 0;
      ptVar7->_vptr_task = (_func_int **)&PTR__task_02189ff0;
      ptVar7[1]._vptr_task = pp_Var20;
      ptVar7[1].super_task_traits.m_version_and_traits = 0;
      ptVar7[1].m_reserved[0] = 1;
      ptVar7[1].m_reserved[1] = (uint64_t)&local_2dd0;
      ptVar7[1].m_reserved[2] = 0;
      ptVar7[1].m_reserved[3] = 1;
      iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar7[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar7[2]._vptr_task + 4) = 5;
      ptVar7[1].m_reserved[5] = (long)iVar5 * 2 & 0x7ffffffffffffffe;
      ptVar7[2].super_task_traits.m_version_and_traits = local_2dc8.m_version_and_traits;
      local_2ce8 = 0;
      local_2ce0 = 1;
      local_2cd8.m_version_and_traits = 1;
      local_2cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar7[1].m_reserved[4] = (uint64_t)&local_2ce8;
      tbb::detail::r1::execute_and_wait(ptVar7,&local_2cc8,&local_2cd8,&local_2cc8);
    }
    cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar4 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    aVar29._8_8_ = uStack_2d60;
    aVar29._0_8_ = local_2d68;
    aVar27._8_8_ = uStack_2d50;
    aVar27._0_8_ = local_2d58;
    aVar25._8_8_ = uStack_2d40;
    aVar25._0_8_ = local_2d48;
    aVar23._8_8_ = uStack_2d30;
    aVar23._0_8_ = local_2d38;
    if (local_2dd8 != (_func_int **)0x0) {
      psVar11 = local_13f8;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar11 + -8) = aVar29;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar11 + -6) = aVar27;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar11 + -4) = aVar25;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar11 + -2) = aVar23;
        *psVar11 = local_2d28;
        psVar11[1] = sStack_2d20;
        aVar29.m128 = (__m128)minps(aVar29.m128,*(undefined1 (*) [16])(psVar11 + -0x288));
        aVar27.m128 = (__m128)maxps(aVar27.m128,*(undefined1 (*) [16])(psVar11 + -0x286));
        aVar25.m128 = (__m128)minps(aVar25.m128,*(undefined1 (*) [16])(psVar11 + -0x284));
        aVar23.m128 = (__m128)maxps(aVar23.m128,*(undefined1 (*) [16])(psVar11 + -0x282));
        local_2d28 = local_2d28 + psVar11[-0x280];
        sStack_2d20 = sStack_2d20 + psVar11[-0x27f];
        psVar11 = psVar11 + 10;
        local_2dd8 = (_func_int **)((long)local_2dd8 + -1);
      } while (local_2dd8 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar29;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar27;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar25;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar23;
    __return_storage_ptr__->begin = local_2d28;
    __return_storage_ptr__->end = sStack_2d20;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(Scene* scene, Geometry::GTypeMask types, bool mblur, const size_t numPrimRefs, mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
         return mesh->createPrimRefArray(prims,sgrids,r,k,(unsigned)geomID);
       }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
          return mesh->createPrimRefArray(prims,sgrids,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }